

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brecovery.cpp
# Opt level: O1

size_t anon_unknown.dwarf_1ed09::remainingSize(istream *input)

{
  long lVar1;
  undefined1 auVar2 [16];
  
  auVar2 = std::istream::tellg();
  std::istream::seekg((long)input,_S_beg);
  lVar1 = std::istream::tellg();
  std::istream::seekg(input,auVar2._0_8_,auVar2._8_8_);
  return lVar1 - auVar2._0_8_;
}

Assistant:

std::size_t remainingSize(std::istream& input)
{
  const auto pos = input.tellg();
  input.seekg(0, std::ios_base::end);
  const auto end = input.tellg();
  const std::size_t size = std::size_t(end - pos);
  input.seekg(pos);
  return size;
}